

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint64_t helper_lq_be_parallel(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t opidx)

{
  Int128 *pIVar1;
  undefined4 extraout_EDX;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  uintptr_t in_R8;
  TCGMemOpIdx unaff_retaddr;
  
  pIVar1 = helper_atomic_ldo_be_mmu_ppc64
                     ((Int128 *)env,(CPUArchState_conflict23 *)addr,
                      CONCAT44(in_register_00000014,opidx),unaff_retaddr,in_R8);
  env->retxh = CONCAT44(extraout_var,extraout_EDX);
  return (uint64_t)pIVar1;
}

Assistant:

uint64_t helper_lq_be_parallel(CPUPPCState *env, target_ulong addr,
                               uint32_t opidx)
{
    Int128 ret;

    /* We will have raised EXCP_ATOMIC from the translator.  */
    assert(HAVE_ATOMIC128);
    ret = helper_atomic_ldo_be_mmu(env, addr, opidx, GETPC());
    env->retxh = int128_gethi(ret);
    return int128_getlo(ret);
}